

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O2

bool __thiscall
FNodeBuilder::ShoveSegBehind(FNodeBuilder *this,DWORD set,node_t *node,DWORD seg,DWORD mate)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  
  SetNodeFromSeg(this,node,(this->Segs).Array + seg);
  this->HackSeg = seg;
  this->HackMate = mate;
  if ((this->Segs).Array[seg].planefront == false) {
    uVar1 = node->dx;
    uVar2 = node->dy;
    node->x = node->x + uVar1;
    node->y = node->y + uVar2;
    node->dx = -uVar1;
    node->dy = -uVar2;
  }
  iVar3 = Heuristic(this,node,set,false);
  return 0 < iVar3;
}

Assistant:

bool FNodeBuilder::ShoveSegBehind (DWORD set, node_t &node, DWORD seg, DWORD mate)
{
	SetNodeFromSeg (node, &Segs[seg]);
	HackSeg = seg;
	HackMate = mate;
	if (!Segs[seg].planefront)
	{
		node.x += node.dx;
		node.y += node.dy;
		node.dx = -node.dx;
		node.dy = -node.dy;
	}
	return Heuristic (node, set, false) > 0;
}